

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O0

void __thiscall
amrex::MFCellConsLinInterp::interp
          (MFCellConsLinInterp *this,MultiFab *crsemf,int ccomp,MultiFab *finemf,int fcomp,int nc,
          IntVect *ng,Geometry *cgeom,Geometry *fgeom,Box *dest_domain,IntVect *ratio,
          Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,int bcomp)

{
  undefined8 uVar1;
  bool bVar2;
  BaseFab<double> *this_00;
  MFIter *in_RDI;
  IntVect *in_stack_00000008;
  Geometry *in_stack_00000010;
  int in_stack_00000038;
  Box result_1;
  Box *fbox;
  Array4<const_double> *ctmp;
  Array4<double> *tmp;
  Box result;
  Box *cbox;
  Array4<const_double> *crse;
  Array4<double> *fine;
  MFIter mfi;
  FArrayBox tmpfab;
  BCRec *pbc;
  Box *cdomain;
  MFIter *in_stack_fffffffffffffa68;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa70;
  int N;
  FabArray<amrex::FArrayBox> *in_stack_fffffffffffffa78;
  MFIter *this_01;
  undefined8 in_stack_fffffffffffffa90;
  uchar flags_;
  FabArrayBase *in_stack_fffffffffffffa98;
  element_type *this_02;
  anon_class_56_7_6a68e4c1 *in_stack_fffffffffffffab0;
  Array4<const_double> *in_stack_fffffffffffffab8;
  Box *in_stack_fffffffffffffac0;
  int local_4b4 [7];
  Box local_498;
  undefined1 local_47c [28];
  undefined1 *local_460;
  Array4<const_double> local_458;
  Array4<const_double> *local_418;
  undefined1 local_410 [80];
  undefined4 uStack_3c0;
  undefined4 local_3bc;
  undefined4 uStack_3b8;
  undefined8 uStack_3b4;
  element_type *local_3a0;
  Box local_398 [2];
  Box *local_358;
  undefined1 local_350 [184];
  undefined1 local_298 [136];
  int *local_210;
  undefined4 local_1fc;
  Box *local_1f8;
  FabArray<amrex::FArrayBox> *local_1f0;
  FabArray<amrex::FArrayBox> *local_1e8;
  _Bit_pointer local_1e0;
  int local_1d8;
  _Bit_pointer local_1d0;
  int local_1c8;
  Dim3 local_1b0;
  __uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_1a0;
  _Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_180;
  undefined4 local_16c;
  MultiArray4<const_double> local_168;
  undefined4 local_15c;
  FBData<amrex::FArrayBox> *local_158;
  undefined4 local_14c;
  FBData<amrex::FArrayBox> *local_148;
  _Bit_pointer local_140;
  int local_138;
  unique_ptr<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
  local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  undefined1 *local_118;
  undefined4 local_10c;
  undefined1 *local_108;
  undefined4 local_fc;
  undefined1 *local_f8;
  Dim3 local_f0;
  Dim3 local_dc;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  int *local_b0;
  double *local_a8;
  Dim3 local_a0;
  int *local_90;
  int local_88;
  int iStack_84;
  int local_80;
  undefined4 local_7c;
  int *local_78;
  undefined4 local_6c;
  int *local_68;
  undefined4 local_5c;
  int *local_58;
  Dim3 local_50;
  int *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  undefined1 *local_28;
  undefined4 local_1c;
  undefined1 *local_18;
  undefined4 local_c;
  int *local_8;
  
  flags_ = (uchar)((ulong)in_stack_fffffffffffffa90 >> 0x38);
  local_298._80_8_ = Geometry::Domain(in_stack_00000010);
  local_298._72_8_ =
       std::vector<amrex::BCRec,_std::allocator<amrex::BCRec>_>::data
                 ((vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *)0x106e04c);
  local_298._72_8_ = local_298._72_8_ + (long)in_stack_00000038 * 0x18;
  FArrayBox::FArrayBox((FArrayBox *)in_stack_fffffffffffffa70);
  MFIter::MFIter(in_RDI,in_stack_fffffffffffffa98,flags_);
  while( true ) {
    bVar2 = MFIter::isValid((MFIter *)(local_350 + 0x58));
    if (!bVar2) break;
    this_01 = (MFIter *)local_350;
    FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffa78,(MFIter *)in_stack_fffffffffffffa70);
    local_350._64_8_ = this_01;
    FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
              (in_stack_fffffffffffffa78,(MFIter *)in_stack_fffffffffffffa70);
    local_358 = local_398;
    this_00 = &FabArray<amrex::FArrayBox>::operator[]
                         (in_stack_fffffffffffffa70,in_stack_fffffffffffffa68)->
               super_BaseFab<double>;
    N = (int)((ulong)in_stack_fffffffffffffa70 >> 0x20);
    local_1f8 = BaseFab<double>::box(this_00);
    local_1fc = 0xffffffff;
    local_410._72_8_ = *(undefined8 *)(local_1f8->smallend).vect;
    uVar1 = *(undefined8 *)((local_1f8->smallend).vect + 2);
    uStack_3b4 = *(undefined8 *)((local_1f8->bigend).vect + 2);
    uStack_3b8 = (undefined4)((ulong)*(undefined8 *)(local_1f8->bigend).vect >> 0x20);
    uStack_3c0 = (undefined4)uVar1;
    local_3bc = (undefined4)((ulong)uVar1 >> 0x20);
    this_02 = (element_type *)(local_410 + 0x48);
    Box::grow((Box *)this_02,-1);
    local_3a0 = this_02;
    FArrayBox::resize((FArrayBox *)this_01,(Box *)in_stack_fffffffffffffa78,N,
                      (Arena *)in_stack_fffffffffffffa68);
    in_stack_fffffffffffffa78 = (FabArray<amrex::FArrayBox> *)local_298;
    local_1a0._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (tuple<amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
          )(local_298 + 0x18);
    local_14c = 0;
    local_15c = 1;
    local_16c = 2;
    local_f8 = local_298 + 0x24;
    local_fc = 0;
    local_128 = local_298._36_4_ + 1;
    local_108 = local_298 + 0x24;
    local_10c = 1;
    iStack_124 = local_298._40_4_ + 1;
    local_118 = local_298 + 0x24;
    local_11c = 2;
    local_1d8 = local_298._44_4_ + 1;
    local_1e0 = (_Bit_pointer)CONCAT44(iStack_124,local_128);
    in_stack_fffffffffffffa70 = (FabArray<amrex::FArrayBox> *)local_410;
    local_1f0 = in_stack_fffffffffffffa78;
    local_1d0 = local_1e0;
    local_1c8 = local_1d8;
    local_180.super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (_Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>)
         (_Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>)
         local_1a0._M_t.
         super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
         .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_168.hp = (Array4<const_double> *)
                   local_1a0._M_t.
                   super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                   .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_158 = (FBData<amrex::FArrayBox> *)
                local_1a0._M_t.
                super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_148 = (FBData<amrex::FArrayBox> *)
                local_1a0._M_t.
                super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
                .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_140 = local_1e0;
    local_138 = local_1d8;
    local_130._M_t.
    super___uniq_ptr_impl<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
    .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl =
         (__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
          )(__uniq_ptr_data<amrex::FBData<amrex::FArrayBox>,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>,_true,_true>
            )local_1a0._M_t.
             super__Tuple_impl<0UL,_amrex::FBData<amrex::FArrayBox>_*,_std::default_delete<amrex::FBData<amrex::FArrayBox>_>_>
             .super__Head_base<0UL,_amrex::FBData<amrex::FArrayBox>_*,_false>._M_head_impl;
    local_120 = local_1d8;
    Array4<double>::Array4
              ((Array4<double> *)in_stack_fffffffffffffa70,(double *)local_298._16_8_,&local_1b0,
               (Dim3 *)&local_1d0,local_298._52_4_);
    local_a8 = *(double **)
                ((long)&(in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op + 4);
    local_b0 = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
               m_crse_ratio.vect + 1;
    local_b4 = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
               m_hishft.vect[2];
    local_5c = 0;
    local_88 = *local_b0;
    local_6c = 1;
    iStack_84 = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                m_crse_ratio.vect[2];
    local_d0.x = local_b0[0];
    local_d0.y = local_b0[1];
    local_7c = 2;
    local_d0.z = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                 m_loshft.vect[0];
    local_8 = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
              m_loshft.vect + 1;
    local_c = 0;
    local_38 = *local_8 + 1;
    local_18 = (undefined1 *)
               ((long)&(in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op + 0x18);
    local_1c = 1;
    iStack_34 = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                m_loshft.vect[2] + 1;
    local_28 = (undefined1 *)
               ((long)&(in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op + 0x18);
    local_2c = 2;
    local_f0.z = (in_stack_fffffffffffffa78->super_FabArrayBase).boxarray.m_bat.m_op.m_bndryReg.
                 m_hishft.vect[0] + 1;
    local_f0.y = iStack_34;
    local_f0.x = local_38;
    local_410._64_8_ = in_stack_fffffffffffffa70;
    local_1e8 = in_stack_fffffffffffffa78;
    local_dc._0_8_ = local_f0._0_8_;
    local_dc.z = local_f0.z;
    local_c0._0_8_ = local_d0._0_8_;
    local_c0.z = local_d0.z;
    local_a0._0_8_ = local_d0._0_8_;
    local_a0.z = local_d0.z;
    local_90 = local_b0;
    local_80 = local_d0.z;
    local_78 = local_b0;
    local_68 = local_b0;
    local_58 = local_b0;
    local_50._0_8_ = local_f0._0_8_;
    local_50.z = local_f0.z;
    local_40 = local_b0;
    local_30 = local_f0.z;
    Array4<const_double>::Array4(&local_458,local_a8,&local_c0,&local_dc,local_b4);
    local_418 = &local_458;
    MFIter::validbox(this_01);
    local_210 = local_4b4;
    Box::grow(&local_498,in_stack_00000008);
    Box::operator&((Box *)in_stack_fffffffffffffa70,(Box *)in_stack_fffffffffffffa68);
    local_460 = local_47c;
    if (((ulong)in_RDI->fabArray & 1) == 0) {
      LoopConcurrentOnCpu<amrex::MFCellConsLinInterp::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__1>
                (in_stack_fffffffffffffac0,(int)((ulong)in_stack_fffffffffffffab8 >> 0x20),
                 (anon_class_56_7_275f29e7 *)in_stack_fffffffffffffab0);
    }
    else {
      LoopConcurrentOnCpu<amrex::MFCellConsLinInterp::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__0>
                (in_stack_fffffffffffffac0,(anon_class_48_6_998f4f4e *)in_stack_fffffffffffffab8);
    }
    in_stack_fffffffffffffab0 = (anon_class_56_7_6a68e4c1 *)(local_298 + 0x5c);
    in_stack_fffffffffffffab8 = local_418;
    in_stack_fffffffffffffac0 = local_358;
    LoopConcurrentOnCpu<amrex::MFCellConsLinInterp::interp(amrex::MultiFab_const&,int,amrex::MultiFab&,int,int,amrex::IntVect_const&,amrex::Geometry_const&,amrex::Geometry_const&,amrex::Box_const&,amrex::IntVect_const&,amrex::Vector<amrex::BCRec,std::allocator<amrex::BCRec>>const&,int)::__2>
              (local_358,(int)((ulong)local_418 >> 0x20),in_stack_fffffffffffffab0);
    MFIter::operator++((MFIter *)(local_350 + 0x58));
  }
  MFIter::~MFIter((MFIter *)in_stack_fffffffffffffa70);
  FArrayBox::~FArrayBox((FArrayBox *)0x106e975);
  return;
}

Assistant:

void
MFCellConsLinInterp::interp (MultiFab const& crsemf, int ccomp, MultiFab& finemf, int fcomp, int nc,
                             IntVect const& ng, Geometry const& cgeom, Geometry const& fgeom,
                             Box const& dest_domain, IntVect const& ratio,
                             Vector<BCRec> const& bcs, int bcomp)
{
    AMREX_ASSERT(crsemf.nGrowVect() == 0);
    amrex::ignore_unused(fgeom);

    Box const& cdomain = cgeom.Domain();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion()) {
        MultiFab crse_tmp(crsemf.boxArray(), crsemf.DistributionMap(), AMREX_SPACEDIM*nc, 0);
        auto const& crse = crsemf.const_arrays();
        auto const& tmp = crse_tmp.arrays();
        auto const& ctmp = crse_tmp.const_arrays();
        auto const& fine = finemf.arrays();

        Gpu::DeviceVector<BCRec> d_bc(nc);
        BCRec const* pbc = d_bc.data();
        Gpu::copyAsync(Gpu::hostToDevice, bcs.begin()+bcomp, bcs.begin()+bcomp+nc, d_bc.begin());

#if (AMREX_SPACEDIM == 1)
        if (cgeom.IsSPHERICAL()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,0,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp[box_no], crse[box_no], ccomp, nc,
                                                        cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int, int, int n) noexcept
            {
                if (dest_domain.contains(i,0,0)) {
                    mf_cell_cons_lin_interp_sph(i, n, fine[box_no], fcomp, ctmp[box_no],
                                                crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#elif (AMREX_SPACEDIM == 2)
        if (cgeom.IsRZ()) {
            Real drf = fgeom.CellSize(0);
            Real rlo = fgeom.Offset(0);
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,0, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope_rz(i,j,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                       cdomain, ratio, pbc, drf, rlo);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int, int n) noexcept
            {
                if (dest_domain.contains(i,j,0)) {
                    mf_cell_cons_lin_interp_rz(i, j, n, fine[box_no], fcomp, ctmp[box_no],
                                               crse[box_no], ccomp, nc, ratio, drf, rlo);
                }
            });
        } else
#endif
        {
            if (do_linear_limiting) {
                ParallelFor(crsemf, IntVect(-1),
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k) noexcept
                {
                    mf_cell_cons_lin_interp_llslope(i,j,k, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, pbc);
                });
            } else {
                ParallelFor(crsemf, IntVect(-1), nc,
                [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
                {
                    mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp[box_no], crse[box_no], ccomp, nc,
                                                    cdomain, ratio, pbc);
                });
            }

            ParallelFor(finemf, ng, nc,
            [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
            {
                if (dest_domain.contains(i,j,k)) {
                    mf_cell_cons_lin_interp(i,j,k,n, fine[box_no], fcomp, ctmp[box_no],
                                            crse[box_no], ccomp, nc, ratio);
                }
            });
        }

        Gpu::streamSynchronize();
    } else
#endif
    {
        BCRec const* pbc = bcs.data() + bcomp;

#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        {
            FArrayBox tmpfab;
            for (MFIter mfi(finemf); mfi.isValid(); ++mfi) {
                auto const& fine = finemf.array(mfi);
                auto const& crse = crsemf.const_array(mfi);

                Box const& cbox = amrex::grow(crsemf[mfi].box(), -1);
                tmpfab.resize(cbox, AMREX_SPACEDIM*nc);
                auto const& tmp = tmpfab.array();
                auto const& ctmp = tmpfab.const_array();

                Box const& fbox = amrex::grow(mfi.validbox(), ng) & dest_domain;

#if (AMREX_SPACEDIM == 1)
                if (cgeom.IsSPHERICAL()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,0,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_sph(i, n, tmp, crse, ccomp, nc,
                                                                cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_sph(i, n, fine, fcomp, ctmp,
                                                    crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#elif (AMREX_SPACEDIM == 2)
                if (cgeom.IsRZ()) {
                    Real drf = fgeom.CellSize(0);
                    Real rlo = fgeom.Offset(0);
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,0, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope_rz(i, j, n, tmp, crse, ccomp, nc,
                                                               cdomain, ratio, pbc, drf, rlo);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int, int n) noexcept
                    {
                        mf_cell_cons_lin_interp_rz(i, j, n, fine, fcomp, ctmp,
                                                   crse, ccomp, nc, ratio, drf, rlo);
                    });
                } else
#endif
                {
                    if (do_linear_limiting) {
                        amrex::LoopConcurrentOnCpu(cbox,
                        [&] (int i, int j, int k) noexcept
                        {
                            mf_cell_cons_lin_interp_llslope(i,j,k, tmp, crse, ccomp, nc,
                                                            cdomain, pbc);
                        });
                    } else {
                        amrex::LoopConcurrentOnCpu(cbox, nc,
                        [&] (int i, int j, int k, int n) noexcept
                        {
                            mf_cell_cons_lin_interp_mcslope(i,j,k,n, tmp, crse, ccomp, nc,
                                                            cdomain, ratio, pbc);
                        });
                    }

                    amrex::LoopConcurrentOnCpu(fbox, nc,
                    [&] (int i, int j, int k, int n) noexcept
                    {
                        mf_cell_cons_lin_interp(i,j,k,n, fine, fcomp, ctmp,
                                                crse, ccomp, nc, ratio);
                    });
                }
            }
        }
    }
}